

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O0

Reals __thiscall Omega_h::get_curvature_metrics(Omega_h *this,Mesh *mesh,Real segment_angle)

{
  LO LVar1;
  Int IVar2;
  void *extraout_RDX;
  Reals RVar3;
  Write<double> local_258;
  Write<double> local_248;
  SurfaceInfo local_238;
  Write<double> local_1d8;
  SurfaceInfo local_1c8;
  undefined1 local_168 [8];
  type f;
  string local_e8 [48];
  undefined1 local_b8 [8];
  Write<double> out;
  SurfaceInfo surface_info;
  Real segment_angle_local;
  Mesh *mesh_local;
  ulong local_10;
  
  get_surface_info((SurfaceInfo *)&out.shared_alloc_.direct_ptr,mesh);
  LVar1 = Mesh::nverts(mesh);
  IVar2 = Mesh::dim(mesh);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"",(allocator *)((long)&f.out.shared_alloc_.direct_ptr + 7))
  ;
  Write<double>::Write
            ((Write<double> *)local_b8,LVar1 * (((IVar2 + 1) * IVar2) / 2),0.0,(string *)local_e8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&f.out.shared_alloc_.direct_ptr + 7));
  IVar2 = Mesh::dim(mesh);
  if (IVar2 == 3) {
    SurfaceInfo::SurfaceInfo((SurfaceInfo *)local_168,(SurfaceInfo *)&out.shared_alloc_.direct_ptr);
    f.surface_info.curv_vert_curvatures.write_.shared_alloc_.direct_ptr = (void *)segment_angle;
    Write<double>::Write((Write<double> *)&f.segment_angle,(Write<double> *)local_b8);
    if (((ulong)out.shared_alloc_.direct_ptr & 1) == 0) {
      local_10 = *out.shared_alloc_.direct_ptr;
    }
    else {
      local_10 = (ulong)out.shared_alloc_.direct_ptr >> 3;
    }
    parallel_for<Omega_h::get_curvature_metrics(Omega_h::Mesh*,double)::__0>
              ((LO)(local_10 >> 2),(type *)local_168);
    SurfaceInfo::SurfaceInfo(&local_1c8,(SurfaceInfo *)&out.shared_alloc_.direct_ptr);
    Write<double>::Write(&local_1d8,(Write<double> *)local_b8);
    get_curve_curvature_metrics<3>(&local_1c8,segment_angle,&local_1d8);
    Write<double>::~Write(&local_1d8);
    SurfaceInfo::~SurfaceInfo(&local_1c8);
    get_curvature_metrics(Omega_h::Mesh*,double)::$_0::~__0((__0 *)local_168);
  }
  else {
    IVar2 = Mesh::dim(mesh);
    if (IVar2 == 2) {
      SurfaceInfo::SurfaceInfo(&local_238,(SurfaceInfo *)&out.shared_alloc_.direct_ptr);
      Write<double>::Write(&local_248,(Write<double> *)local_b8);
      get_curve_curvature_metrics<2>(&local_238,segment_angle,&local_248);
      Write<double>::~Write(&local_248);
      SurfaceInfo::~SurfaceInfo(&local_238);
    }
  }
  Write<double>::Write(&local_258,(Write<signed_char> *)local_b8);
  Read<double>::Read((Read<double> *)this,&local_258);
  Write<double>::~Write(&local_258);
  Write<double>::~Write((Write<double> *)local_b8);
  SurfaceInfo::~SurfaceInfo((SurfaceInfo *)&out.shared_alloc_.direct_ptr);
  RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar3.write_.shared_alloc_;
}

Assistant:

Reals get_curvature_metrics(Mesh* mesh, Real segment_angle) {
  auto surface_info = get_surface_info(mesh);
  auto out = Write<Real>(mesh->nverts() * symm_ncomps(mesh->dim()), 0.0);
  if (mesh->dim() == 3) {
    /* this algorithm creates degenerate metrics that only specify size in
       the two tangential directions to mesh surfaces */
    auto f = OMEGA_H_LAMBDA(LO const surf_vert) {
      auto const II = get_symm<2>(surface_info.surf_vert_IIs, surf_vert);
      auto const II_decomp = decompose_eigen(II);
      Vector<2> m_ews;
      for (Int i = 0; i < 2; ++i) {
        m_ews[i] = square(II_decomp.l[i] / segment_angle);
      }
      auto const n = get_vector<3>(surface_info.surf_vert_normals, surf_vert);
      auto const frame = form_ortho_basis(n);
      Matrix<3, 2> surf_frame_t;
      surf_frame_t[0] = frame[1];
      surf_frame_t[1] = frame[2];
      auto const surf_frame = transpose(surf_frame_t);
      auto const m_q_inv = II_decomp.q * surf_frame;
      auto const m_q = pseudo_invert(m_q_inv);
      auto const m = m_q * diagonal(m_ews) * m_q_inv;
      auto const vert = surface_info.surf_vert2vert[surf_vert];
      set_symm(out, vert, m);
    };
    parallel_for(surface_info.surf_vert2vert.size(), std::move(f));
    get_curve_curvature_metrics<3>(surface_info, segment_angle, out);
  } else if (mesh->dim() == 2) {
    get_curve_curvature_metrics<2>(surface_info, segment_angle, out);
  }
  return out;
}